

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O3

pair<unsigned_int,_unsigned_int>
deqp::gls::anon_unknown_1::createAndAttachShaders
          (TestLog *log,RenderContext *renderCtx,deUint32 program,
          vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
          *attributes,bool attributeAliasing)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Cond *pCVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ContextType CVar11;
  GLSLVersion GVar12;
  deUint32 dVar13;
  undefined4 extraout_var;
  ostream *poVar14;
  long *plVar15;
  ostream *poVar16;
  _Rb_tree_node_base *p_Var17;
  char *pcVar18;
  mapped_type *pmVar19;
  pointer pcVar20;
  char *__s;
  pair<unsigned_int,_unsigned_int> pVar21;
  TestError *this_00;
  deUint32 shader;
  long *plVar22;
  ulong *puVar23;
  undefined8 uVar24;
  char *pcVar25;
  pointer pAVar26;
  undefined7 in_register_00000081;
  uint uVar27;
  GLSLVersion version;
  Cond *pCVar28;
  Attribute *pAVar29;
  string fragmentShaderSource;
  size_type __dnew_2;
  size_type __dnew_4;
  ostringstream src_1;
  ScopedLogSection shaderSection;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parameters;
  string vertexShaderSource;
  ostringstream src;
  StringTemplate vertexShaderTemplate;
  undefined1 local_5f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  undefined1 local_5c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5b0;
  deUint32 local_59c;
  ScopedLogSection local_598;
  long local_590;
  TestLog local_588 [2];
  int local_578;
  GLSLVersion local_574;
  undefined1 local_570 [8];
  _Alloc_hider local_568;
  undefined1 local_560 [16];
  undefined3 local_550;
  undefined5 uStack_54d;
  size_t local_548;
  ios_base local_500 [264];
  ScopedLogSection local_3f8;
  long local_3f0;
  TestLog local_3e8 [2];
  long *local_3d8;
  long local_3d0;
  long local_3c8;
  long lStack_3c0;
  undefined1 local_3b8 [8];
  undefined1 local_3b0 [24];
  _Base_ptr local_398;
  size_t local_390;
  ios_base local_348 [8];
  ios_base local_340 [264];
  ostream *local_238;
  RenderContext *local_230;
  string local_228;
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  key_type local_1c8 [3];
  ios_base local_158 [264];
  StringTemplate local_50;
  _anonymous_namespace_ *this;
  
  local_59c = program;
  iVar10 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  this = (_anonymous_namespace_ *)CONCAT44(extraout_var,iVar10);
  local_230 = renderCtx;
  CVar11.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  GVar12 = glu::getContextTypeGLSLVersion(CVar11);
  local_578 = (int)CONCAT71(in_register_00000081,attributeAliasing);
  if (local_578 == 0) {
LAB_0096e422:
    local_574 = GVar12;
  }
  else {
    bVar7 = glu::glslVersionIsES(GVar12);
    local_574 = GLSL_VERSION_100_ES;
    if (!bVar7) goto LAB_0096e422;
  }
  bVar7 = glu::glslVersionUsesInOutQualifiers(local_574);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"${VERSION}\n${VTX_OUTPUT} mediump vec4 v_color;\n",0x2f);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
  pAVar26 = (attributes->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pAVar26 !=
      (attributes->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    puVar1 = (ulong *)(local_5c8 + 0x10);
    do {
      if (pAVar26->m_layoutLocation != -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_570,"layout(location = ",0x12);
        poVar14 = (ostream *)std::ostream::operator<<(local_570,pAVar26->m_layoutLocation);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,") ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_570,"${VTX_INPUT} mediump ",0x15);
      pcVar20 = (pAVar26->m_type).m_name._M_dataplus._M_p;
      local_5f0._0_8_ = local_5f0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5f0,pcVar20,pcVar20 + (pAVar26->m_type).m_name._M_string_length);
      local_5d8._8_4_ = (pAVar26->m_type).m_locationSize;
      local_5d8._12_4_ = (pAVar26->m_type).m_glTypeEnum;
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_570,(char *)local_5f0._0_8_,local_5f0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(pAVar26->m_name)._M_dataplus._M_p,
                           (pAVar26->m_name)._M_string_length);
      iVar10 = pAVar26->m_arraySize;
      if (iVar10 == -1) {
        local_5c8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_5c8._16_8_ = local_5c8._16_8_ & 0xffffffffffffff00;
        local_5c8._0_8_ = puVar1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
        std::ostream::operator<<((ostringstream *)local_3b8,iVar10);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
        std::ios_base::~ios_base(local_348);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xb22dc1);
        local_3d8 = &local_3c8;
        plVar22 = plVar15 + 2;
        if ((long *)*plVar15 == plVar22) {
          local_3c8 = *plVar22;
          lStack_3c0 = plVar15[3];
        }
        else {
          local_3c8 = *plVar22;
          local_3d8 = (long *)*plVar15;
        }
        local_3d0 = plVar15[1];
        *plVar15 = (long)plVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_3d8);
        puVar23 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar23) {
          local_5c8._16_8_ = *puVar23;
          aStack_5b0._M_allocated_capacity = plVar15[3];
          local_5c8._0_8_ = puVar1;
        }
        else {
          local_5c8._16_8_ = *puVar23;
          local_5c8._0_8_ = (ulong *)*plVar15;
        }
        local_5c8._8_8_ = plVar15[1];
        *plVar15 = (long)puVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
      }
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_5c8._0_8_,local_5c8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
      if ((ulong *)local_5c8._0_8_ != puVar1) {
        operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
      }
      if (iVar10 != -1) {
        if (local_3d8 != &local_3c8) {
          operator_delete(local_3d8,local_3c8 + 1);
        }
        if (local_208[0] != local_1f8) {
          operator_delete(local_208[0],local_1f8[0] + 1);
        }
      }
      if ((undefined1 *)local_5f0._0_8_ != local_5f0 + 0x10) {
        operator_delete((void *)local_5f0._0_8_,local_5f0._16_8_ + 1);
      }
      pAVar26 = pAVar26 + 1;
    } while (pAVar26 !=
             (attributes->
             super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
  std::ios_base::~ios_base(local_500);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,(char *)local_598.m_log,local_590);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
  local_568._M_p = (pointer)((ulong)local_568._M_p._4_4_ << 0x20);
  local_560._0_4_ = 0;
  local_560._4_4_ = 0;
  local_560[8] = SUB81((_Base_ptr)&local_568,0);
  local_560[9] = (undefined1)((ulong)&local_568 >> 8);
  local_560[10] = (undefined1)((ulong)&local_568 >> 0x10);
  local_560._11_4_ = (undefined4)((ulong)&local_568 >> 0x18);
  local_560[0xf] = (undefined1)((ulong)&local_568 >> 0x38);
  local_548 = 0;
  pAVar26 = (attributes->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  _local_550 = (_Base_ptr)&local_568;
  if (pAVar26 !=
      (attributes->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pCVar28 = &pAVar26->m_cond;
    local_238 = poVar14;
    do {
      bVar9 = false;
      local_5f0._0_8_ = local_5f0._0_8_ & 0xffffffffffffff00;
      local_5d8._M_allocated_capacity = 0x737961776c615f5f;
      local_5f0._16_8_ = 10;
      local_5d8._8_3_ = 0x5f5f;
      local_5f0._8_8_ = &local_5d8;
      bVar8 = AttributeLocationTestUtil::Cond::operator==(pCVar28,(Cond *)local_5f0);
      if (!bVar8) {
        local_5c8[0] = 1;
        aStack_5b0._M_allocated_capacity = 0x737961776c615f5f;
        aStack_5b0._8_2_ = 0x5f5f;
        local_5c8._16_8_ = 10;
        aStack_5b0._M_local_buf[10] = '\0';
        local_5c8._8_8_ = &aStack_5b0;
        bVar9 = AttributeLocationTestUtil::Cond::operator==(pCVar28,(Cond *)local_5c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._8_8_ != &aStack_5b0) {
          operator_delete((void *)local_5c8._8_8_,aStack_5b0._M_allocated_capacity + 1);
        }
        bVar9 = !bVar9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._8_8_ != &local_5d8) {
        operator_delete((void *)local_5f0._8_8_,local_5d8._M_allocated_capacity + 1);
      }
      if (bVar9) {
        pcVar20 = (pCVar28->m_name)._M_dataplus._M_p;
        local_5f0._0_8_ = local_5f0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5f0,pcVar20,pcVar20 + (pCVar28->m_name)._M_string_length);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_570,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0);
        if ((undefined1 *)local_5f0._0_8_ != local_5f0 + 0x10) {
          operator_delete((void *)local_5f0._0_8_,local_5f0._16_8_ + 1);
        }
      }
      poVar14 = local_238;
      pCVar3 = pCVar28 + 1;
      pCVar28 = (Cond *)&pCVar28[3].m_name;
    } while ((pointer)&pCVar3->m_name !=
             (attributes->
             super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    p_Var17 = (_Rb_tree_node_base *)
              CONCAT17(local_560[0xf],
                       CONCAT43(local_560._11_4_,
                                CONCAT12(local_560[10],CONCAT11(local_560[9],local_560[8]))));
    if (p_Var17 != (_Rb_tree_node_base *)&local_568) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b8,"uniform mediump float u_",0x18);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3b8,*(char **)(p_Var17 + 1),(long)p_Var17[1]._M_parent
                            );
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
      } while (p_Var17 != (_Rb_tree_node_base *)&local_568);
    }
  }
  std::__cxx11::stringbuf::str();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_570);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  std::ios_base::~ios_base(local_348);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(char *)local_3f8.m_log,local_3f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
  if (local_3f8.m_log != local_3e8) {
    operator_delete(local_3f8.m_log,(ulong)((long)&(local_3e8[0].m_log)->flags + 1));
  }
  if (local_598.m_log != local_588) {
    operator_delete(local_598.m_log,(ulong)((long)&(local_588[0].m_log)->flags + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"void main (void)\n{\n\tmediump vec4 color = vec4(0.0);\n\n",0x35)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
  pAVar26 = (attributes->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pAVar26 !=
      (attributes->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pCVar28 = &pAVar26->m_cond;
      uVar24 = 0;
      local_570 = (undefined1  [8])((ulong)local_570 & 0xffffffffffffff00);
      local_560[8] = '_';
      local_560[9] = '_';
      local_560[10] = 'a';
      local_560._11_4_ = 0x7961776c;
      local_560[0xf] = 's';
      local_560._0_4_ = 10;
      local_560._4_4_ = 0;
      local_550 = 0x5f5f;
      local_568._M_p = local_560 + 8;
      bVar9 = AttributeLocationTestUtil::Cond::operator==(pCVar28,(Cond *)local_570);
      if (local_568._M_p != local_560 + 8) {
        operator_delete(local_568._M_p,
                        CONCAT17(local_560[0xf],
                                 CONCAT43(local_560._11_4_,
                                          CONCAT12(local_560[10],CONCAT11(local_560[9],local_560[8])
                                                  ))) + 1);
      }
      if (bVar9) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b8,"\tif (0 != 0)\n\t{\n",0x10);
        iVar10 = (int)uVar24;
        if (pAVar26->m_arraySize == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b8,"\t\tcolor += ",0xb);
          (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                    ((string *)local_570,(_anonymous_namespace_ *)pAVar26,(Attribute *)0xffffffff,
                     iVar10);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b8,(char *)local_570,(long)local_568._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
LAB_0096ef42:
          if (local_570 != (undefined1  [8])local_560) {
            operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
          }
        }
        else if (0 < pAVar26->m_arraySize) {
          pAVar29 = (Attribute *)0x0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b8,"\t\tcolor += ",0xb);
            (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                      ((string *)local_570,(_anonymous_namespace_ *)pAVar26,pAVar29,(int)uVar24);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b8,(char *)local_570,(long)local_568._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
            if (local_570 != (undefined1  [8])local_560) {
              operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
            }
            uVar27 = (int)pAVar29 + 1;
            pAVar29 = (Attribute *)(ulong)uVar27;
          } while ((int)uVar27 < pAVar26->m_arraySize);
        }
LAB_0096ef67:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"\t}\n",3);
      }
      else {
        local_570[0] = 1;
        local_560[8] = '_';
        local_560[9] = '_';
        local_560[10] = 'a';
        local_560._11_4_ = 0x7961776c;
        local_560[0xf] = 's';
        local_560._0_4_ = 10;
        local_560._4_4_ = 0;
        local_550 = 0x5f5f;
        local_568._M_p = local_560 + 8;
        bVar9 = AttributeLocationTestUtil::Cond::operator==(pCVar28,(Cond *)local_570);
        if (local_568._M_p != local_560 + 8) {
          operator_delete(local_568._M_p,
                          CONCAT17(local_560[0xf],
                                   CONCAT43(local_560._11_4_,
                                            CONCAT12(local_560[10],
                                                     CONCAT11(local_560[9],local_560[8])))) + 1);
        }
        iVar10 = (int)uVar24;
        if (!bVar9) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"\tif (u_",7);
          local_570 = (undefined1  [8])local_560;
          pcVar20 = (pAVar26->m_cond).m_name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_570,pcVar20,pcVar20 + (pAVar26->m_cond).m_name._M_string_length
                    );
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b8,(char *)local_570,(long)local_568._M_p);
          pcVar25 = " == ";
          if (pCVar28->m_negate != false) {
            pcVar25 = " != ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar25,4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"0.0)\n\t{\n",8);
          if (local_570 != (undefined1  [8])local_560) {
            operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
          }
          iVar10 = (int)uVar24;
          if (pAVar26->m_arraySize == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b8,"\t\tcolor += ",0xb);
            (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                      ((string *)local_570,(_anonymous_namespace_ *)pAVar26,(Attribute *)0xffffffff,
                       iVar10);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b8,(char *)local_570,(long)local_568._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
            goto LAB_0096ef42;
          }
          if (0 < pAVar26->m_arraySize) {
            pAVar29 = (Attribute *)0x0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b8,"\t\tcolor += ",0xb);
              (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                        ((string *)local_570,(_anonymous_namespace_ *)pAVar26,pAVar29,(int)uVar24);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3b8,(char *)local_570,(long)local_568._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
              if (local_570 != (undefined1  [8])local_560) {
                operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
              }
              uVar27 = (int)pAVar29 + 1;
              pAVar29 = (Attribute *)(ulong)uVar27;
            } while ((int)uVar27 < pAVar26->m_arraySize);
          }
          goto LAB_0096ef67;
        }
        if (pAVar26->m_arraySize == -1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"\tcolor += ",10);
          (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                    ((string *)local_570,(_anonymous_namespace_ *)pAVar26,(Attribute *)0xffffffff,
                     iVar10);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b8,(char *)local_570,(long)local_568._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
          if (local_570 != (undefined1  [8])local_560) {
            operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
          }
        }
        else if (0 < pAVar26->m_arraySize) {
          pAVar29 = (Attribute *)0x0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b8,"\tcolor += ",10);
            (anonymous_namespace)::generateToVec4Expression_abi_cxx11_
                      ((string *)local_570,(_anonymous_namespace_ *)pAVar26,pAVar29,(int)uVar24);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b8,(char *)local_570,(long)local_568._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
            if (local_570 != (undefined1  [8])local_560) {
              operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
            }
            uVar27 = (int)pAVar29 + 1;
            pAVar29 = (Attribute *)(ulong)uVar27;
          } while ((int)uVar27 < pAVar26->m_arraySize);
        }
      }
      pAVar26 = pAVar26 + 1;
    } while (pAVar26 !=
             (attributes->
             super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  std::ios_base::~ios_base(local_348);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,(char *)local_5f0._0_8_,local_5f0._8_8_);
  if ((undefined1 *)local_5f0._0_8_ != local_5f0 + 0x10) {
    operator_delete((void *)local_5f0._0_8_,local_5f0._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"\n\tv_color = color;\n\tgl_Position = color;\n}\n",0x2b);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  tcu::StringTemplate::StringTemplate(&local_50,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_3b0._0_8_ = (ulong)(uint)local_3b0._4_4_ << 0x20;
  local_3b0._8_8_ = (_Base_ptr)0x0;
  local_390 = 0;
  local_3b0._16_8_ = (_Base_ptr)local_3b0;
  local_398 = (_Base_ptr)local_3b0;
  pcVar18 = glu::getGLSLVersionDeclaration(local_574);
  local_560._0_4_ = 0x53524556;
  local_568._M_p = (pointer)0x7;
  local_560._4_4_ = 0x4e4f49;
  local_570 = (undefined1  [8])local_560;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_570);
  pcVar25 = (char *)pmVar19->_M_string_length;
  strlen(pcVar18);
  std::__cxx11::string::_M_replace((ulong)pmVar19,0,pcVar25,(ulong)pcVar18);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  local_560._0_4_ = 0x5f585456;
  local_560._4_4_ = 0x5054554f;
  local_560[8] = 'U';
  local_560[9] = 'T';
  local_568._M_p = (pointer)0xa;
  local_560[10] = '\0';
  local_570 = (undefined1  [8])local_560;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_570);
  pcVar18 = "varying";
  pcVar25 = "varying";
  if (bVar7) {
    pcVar25 = "out";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  local_560._0_4_ = 0x5f585456;
  local_560._4_4_ = 0x55504e49;
  local_560[8] = 'T';
  local_560[9] = '\0';
  local_568._M_p = (pointer)0x9;
  local_570 = (undefined1  [8])local_560;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_570);
  pcVar25 = "attribute";
  if (bVar7) {
    pcVar25 = "in";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  local_560._0_4_ = 0x47415246;
  local_560._4_4_ = 0x504e495f;
  local_560[8] = 'U';
  local_560[9] = 'T';
  local_568._M_p = (pointer)0xa;
  local_560[10] = '\0';
  local_570 = (undefined1  [8])local_560;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_570);
  pcVar25 = "varying";
  if (bVar7) {
    pcVar25 = "in";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  local_560._0_4_ = 0x47415246;
  local_560._4_4_ = 0x54554f5f;
  local_560[8] = 'P';
  local_560[9] = 'U';
  local_560[10] = 'T';
  local_560._11_4_ = 0x5241565f;
  local_568._M_p = (pointer)0xf;
  local_560[0xf] = '\0';
  local_570 = (undefined1  [8])local_560;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_570);
  pcVar25 = "gl_FragColor";
  if (bVar7) {
    pcVar25 = "dEQP_FragColor";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  pcVar25 = "";
  if (bVar7) {
    pcVar25 = "layout(location=0) out mediump vec4 dEQP_FragColor;";
  }
  local_1c8[0]._M_dataplus._M_p = (pointer)0x17;
  local_570 = (undefined1  [8])local_560;
  local_570 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_570,(ulong)local_1c8);
  local_560._0_4_ = SUB84(local_1c8[0]._M_dataplus._M_p,0);
  local_560._4_4_ = (undefined4)((ulong)local_1c8[0]._M_dataplus._M_p >> 0x20);
  builtin_strncpy((char *)local_570,"FRAG_OUTPUT_DECLARATION",0x17);
  local_568._M_p = local_1c8[0]._M_dataplus._M_p;
  *(char *)((long)local_570 + (long)local_1c8[0]._M_dataplus._M_p) = '\0';
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,(key_type *)local_570);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  tcu::StringTemplate::specialize
            (&local_228,&local_50,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_3b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3b8);
  tcu::StringTemplate::~StringTemplate(&local_50);
  CVar11.super_ApiType.m_bits = (ApiType)(*local_230->_vptr_RenderContext[2])();
  GVar12 = glu::getContextTypeGLSLVersion(CVar11);
  if ((char)local_578 != '\0') {
    bVar7 = glu::glslVersionIsES(GVar12);
    version = GLSL_VERSION_100_ES;
    if (bVar7) goto LAB_0096f47c;
  }
  version = GVar12;
LAB_0096f47c:
  local_3b8 = (undefined1  [8])(local_3b0 + 8);
  local_1c8[0]._M_dataplus._M_p = (pointer)0x7e;
  pcVar20 = (pointer)std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)local_1c8);
  _Var6._M_p = local_1c8[0]._M_dataplus._M_p;
  local_3b0._8_8_ = local_1c8[0]._M_dataplus._M_p;
  local_3b8 = (undefined1  [8])pcVar20;
  memcpy(pcVar20,
         "${VERSION}\n${FRAG_OUTPUT_DECLARATION}\n${FRAG_INPUT} mediump vec4 v_color;\nvoid main (void)\n{\n\t${FRAG_OUTPUT_VAR} = v_color;\n}\n"
         ,0x7e);
  local_3b0._0_8_ = _Var6._M_p;
  pcVar20[_Var6._M_p] = '\0';
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_570,(string *)local_3b8);
  if (local_3b8 != (undefined1  [8])(local_3b0 + 8)) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  bVar7 = glu::glslVersionUsesInOutQualifiers(version);
  local_3b0._0_8_ = local_3b0._0_8_ & 0xffffffff00000000;
  local_3b0._8_8_ = (_Base_ptr)0x0;
  local_390 = 0;
  local_3b0._16_8_ = (_Base_ptr)local_3b0;
  local_398 = (_Base_ptr)local_3b0;
  __s = glu::getGLSLVersionDeclaration(version);
  local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
  local_1c8[0].field_2._M_allocated_capacity._0_4_ = 0x53524556;
  local_1c8[0]._M_string_length = 7;
  local_1c8[0].field_2._M_allocated_capacity._4_4_ = 0x4e4f49;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1c8);
  pcVar25 = (char *)pmVar19->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar19,0,pcVar25,(ulong)__s);
  paVar2 = &local_1c8[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0]._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].field_2._M_allocated_capacity) + 1);
  }
  local_1c8[0].field_2._M_allocated_capacity._0_4_ = 0x5f585456;
  local_1c8[0].field_2._M_allocated_capacity._4_4_ = 0x5054554f;
  local_1c8[0].field_2._8_2_ = 0x5455;
  local_1c8[0]._M_string_length = 10;
  local_1c8[0].field_2._M_local_buf[10] = '\0';
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1c8);
  pcVar25 = "out";
  if (!bVar7) {
    pcVar25 = "varying";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0]._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].field_2._M_allocated_capacity) + 1);
  }
  local_1c8[0].field_2._M_allocated_capacity._0_4_ = 0x5f585456;
  local_1c8[0].field_2._M_allocated_capacity._4_4_ = 0x55504e49;
  local_1c8[0].field_2._8_2_ = 0x54;
  local_1c8[0]._M_string_length = 9;
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1c8);
  pcVar25 = "attribute";
  if (bVar7) {
    pcVar25 = "in";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0]._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].field_2._M_allocated_capacity) + 1);
  }
  local_1c8[0].field_2._M_allocated_capacity._0_4_ = 0x47415246;
  local_1c8[0].field_2._M_allocated_capacity._4_4_ = 0x504e495f;
  local_1c8[0].field_2._8_2_ = 0x5455;
  local_1c8[0]._M_string_length = 10;
  local_1c8[0].field_2._M_local_buf[10] = '\0';
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1c8);
  if (bVar7) {
    pcVar18 = "in";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0]._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].field_2._M_allocated_capacity) + 1);
  }
  local_1c8[0].field_2._M_allocated_capacity._0_4_ = 0x47415246;
  local_1c8[0].field_2._M_allocated_capacity._4_4_ = 0x54554f5f;
  local_1c8[0].field_2._8_2_ = 0x5550;
  local_1c8[0].field_2._M_local_buf[10] = 'T';
  local_1c8[0].field_2._11_4_ = 0x5241565f;
  local_1c8[0]._M_string_length = 0xf;
  local_1c8[0].field_2._M_local_buf[0xf] = '\0';
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1c8);
  pcVar18 = "";
  pcVar25 = "gl_FragColor";
  if (bVar7) {
    pcVar25 = "dEQP_FragColor";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar25);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0]._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].field_2._M_allocated_capacity) + 1);
  }
  if (bVar7) {
    pcVar18 = "layout(location=0) out mediump vec4 dEQP_FragColor;";
  }
  local_5c8._0_8_ = (char *)0x17;
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar2;
  local_1c8[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_1c8,(ulong)local_5c8);
  local_1c8[0].field_2._M_allocated_capacity._0_4_ = (undefined4)local_5c8._0_8_;
  local_1c8[0].field_2._M_allocated_capacity._4_4_ = SUB84(local_5c8._0_8_,4);
  builtin_strncpy(local_1c8[0]._M_dataplus._M_p,"FRAG_OUTPUT_DECLARATION",0x17);
  local_1c8[0]._M_string_length = local_5c8._0_8_;
  local_1c8[0]._M_dataplus._M_p[local_5c8._0_8_] = '\0';
  pmVar19 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3b8,local_1c8);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar19,0,(char *)pmVar19->_M_string_length,(ulong)pcVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0]._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].field_2._M_allocated_capacity) + 1);
  }
  tcu::StringTemplate::specialize
            ((string *)local_5f0,(StringTemplate *)local_570,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_3b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3b8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_570);
  pVar21.first = (**(code **)(this + 0x3f0))(0x8b31);
  uVar27 = (**(code **)(this + 0x3f0))(0x8b30);
  pcVar25 = local_3b0 + 8;
  dVar13 = (**(code **)(this + 0x800))();
  glu::checkError(dVar13,"glCreateShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1a7);
  local_3b8 = (undefined1  [8])local_228._M_dataplus._M_p;
  local_570 = (undefined1  [8])local_5f0._0_8_;
  (**(code **)(this + 0x12b8))(pVar21.first,1,local_3b8,0);
  (**(code **)(this + 0x12b8))(uVar27,1,local_570,0);
  dVar13 = (**(code **)(this + 0x800))();
  glu::checkError(dVar13,"glShaderSource()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b0);
  (**(code **)(this + 0x248))(pVar21.first);
  (**(code **)(this + 0x248))(uVar27);
  dVar13 = (**(code **)(this + 0x800))();
  glu::checkError(dVar13,"glCompileShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b5);
  (**(code **)(this + 0x10))(local_59c,pVar21.first);
  (**(code **)(this + 0x10))(local_59c,uVar27);
  dVar13 = (**(code **)(this + 0x800))();
  glu::checkError(dVar13,"glAttachShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x1b9);
  (**(code **)(this + 0xa70))(pVar21.first,0x8b81,local_3b8);
  dVar13 = (**(code **)(this + 0x800))();
  glu::checkError(dVar13,"glGetShaderiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x148);
  uVar4 = local_3b8._0_4_;
  (**(code **)(this + 0xa70))(uVar27,0x8b81);
  dVar13 = (**(code **)(this + 0x800))();
  shader = 0x148;
  glu::checkError(dVar13,"glGetShaderiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x148);
  uVar5 = local_3b8._0_4_;
  (anonymous_namespace)::getShaderInfoLog_abi_cxx11_
            (local_1c8,this,(Functions *)(ulong)pVar21.first,shader);
  (anonymous_namespace)::getShaderInfoLog_abi_cxx11_
            ((string *)local_5c8,this,(Functions *)(ulong)uVar27,shader);
  local_570 = (undefined1  [8])0x12;
  local_3b8 = (undefined1  [8])pcVar25;
  local_3b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)local_570);
  local_3b0._8_8_ = local_570;
  builtin_strncpy((char *)local_3b8,"Vertex Shader Info",0x12);
  local_3b0._0_8_ = local_570;
  *(char *)((long)local_3b8 + (long)local_570) = '\0';
  local_570 = (undefined1  [8])local_560;
  local_598.m_log = (TestLog *)0x12;
  local_570 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_570,(ulong)&local_598)
  ;
  local_560._0_4_ = SUB84(local_598.m_log,0);
  local_560._4_4_ = (undefined4)((ulong)local_598.m_log >> 0x20);
  builtin_strncpy((char *)local_570,"Vertex Shader Info",0x12);
  local_568._M_p = (pointer)local_598.m_log;
  *(char *)((long)local_570 + (long)local_598.m_log) = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&local_3f8,log,(string *)local_3b8,(string *)local_570);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  if (local_3b8 != (undefined1  [8])pcVar25) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b8 = (undefined1  [8])pcVar25;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_228._M_dataplus._M_p,
             local_228._M_dataplus._M_p + local_228._M_string_length);
  tcu::TestLog::writeKernelSource(log,(char *)local_3b8);
  if (local_3b8 != (undefined1  [8])pcVar25) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b0._8_8_ = (_Base_ptr)0x676f4c206f666e49;
  local_3b0._0_8_ = 8;
  local_3b0._16_8_ = local_3b0._16_8_ & 0xffffffffffffff00;
  local_560._0_4_ = 0x6f666e49;
  local_560._4_4_ = 0x676f4c20;
  local_568._M_p = (pointer)0x8;
  local_560[8] = '\0';
  local_570 = (undefined1  [8])local_560;
  local_3b8 = (undefined1  [8])pcVar25;
  tcu::ScopedLogSection::ScopedLogSection(&local_598,log,(string *)local_3b8,(string *)local_570);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  if (local_3b8 != (undefined1  [8])(local_3b0 + 8)) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,local_1c8[0]._M_dataplus._M_p,local_1c8[0]._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  tcu::TestLog::endSection(local_598.m_log);
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,"Compilation result: ",0x14);
  pcVar25 = "Failed";
  pcVar18 = "Failed";
  if (uVar4 == 1) {
    pcVar18 = "Ok";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,pcVar18,(ulong)(uVar4 != 1) * 4 + 2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  tcu::TestLog::endSection(local_3f8.m_log);
  pcVar18 = local_3b0 + 8;
  local_570 = (undefined1  [8])0x14;
  local_3b8 = (undefined1  [8])pcVar18;
  local_3b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)local_570);
  local_3b0._8_8_ = local_570;
  builtin_strncpy((char *)local_3b8,"Fragment Shader Info",0x14);
  local_3b0._0_8_ = local_570;
  *(char *)((long)local_3b8 + (long)local_570) = '\0';
  local_570 = (undefined1  [8])local_560;
  local_598.m_log = (TestLog *)0x14;
  local_570 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_570,(ulong)&local_598)
  ;
  local_560._0_4_ = SUB84(local_598.m_log,0);
  local_560._4_4_ = (undefined4)((ulong)local_598.m_log >> 0x20);
  builtin_strncpy((char *)local_570,"Fragment Shader Info",0x14);
  local_568._M_p = (pointer)local_598.m_log;
  *(char *)((long)local_570 + (long)local_598.m_log) = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&local_3f8,log,(string *)local_3b8,(string *)local_570);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  if (local_3b8 != (undefined1  [8])pcVar18) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b8 = (undefined1  [8])pcVar18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,local_5f0._0_8_,(char *)(local_5f0._8_8_ + local_5f0._0_8_));
  tcu::TestLog::writeKernelSource(log,(char *)local_3b8);
  if (local_3b8 != (undefined1  [8])pcVar18) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b0._8_8_ = (_Base_ptr)0x676f4c206f666e49;
  local_3b0._0_8_ = 8;
  local_3b0._16_8_ = local_3b0._16_8_ & 0xffffffffffffff00;
  local_560._0_4_ = 0x6f666e49;
  local_560._4_4_ = 0x676f4c20;
  local_568._M_p = (pointer)0x8;
  local_560[8] = '\0';
  local_570 = (undefined1  [8])local_560;
  local_3b8 = (undefined1  [8])pcVar18;
  tcu::ScopedLogSection::ScopedLogSection(&local_598,log,(string *)local_3b8,(string *)local_570);
  if (local_570 != (undefined1  [8])local_560) {
    operator_delete((void *)local_570,CONCAT44(local_560._4_4_,local_560._0_4_) + 1);
  }
  if (local_3b8 != (undefined1  [8])(local_3b0 + 8)) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
  }
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,(char *)local_5c8._0_8_,local_5c8._8_8_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  tcu::TestLog::endSection(local_598.m_log);
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,"Compilation result: ",0x14);
  if (uVar5 == 1) {
    pcVar25 = "Ok";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,pcVar25,(ulong)(uVar5 != 1) * 4 + 2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  tcu::TestLog::endSection(local_3f8.m_log);
  if (uVar4 == 1) {
    if (uVar5 == 1) {
      if ((undefined1 *)local_5c8._0_8_ != local_5c8 + 0x10) {
        operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
        operator_delete(local_1c8[0]._M_dataplus._M_p,
                        CONCAT44(local_1c8[0].field_2._M_allocated_capacity._4_4_,
                                 (undefined4)local_1c8[0].field_2._M_allocated_capacity) + 1);
      }
      (**(code **)(this + 0x470))(pVar21.first);
      (**(code **)(this + 0x470))(uVar27);
      if ((undefined1 *)local_5f0._0_8_ != local_5f0 + 0x10) {
        operator_delete((void *)local_5f0._0_8_,local_5f0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      pVar21.second = uVar27;
      return pVar21;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Fragment shader compilation failed","fragmentCompileOk",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
               ,0x1c5);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Vertex shader compilation failed","vertexCompileOk",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
               ,0x1c4);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

pair<deUint32, deUint32> createAndAttachShaders (TestLog& log, glu::RenderContext& renderCtx, deUint32 program, const vector<Attribute>& attributes, bool attributeAliasing)
{
	const glw::Functions&	gl						= renderCtx.getFunctions();
	const string			vertexShaderSource		= createVertexShaderSource(renderCtx, attributes, attributeAliasing);
	const string			fragmentShaderSource	= createFragmentShaderSource(renderCtx, attributeAliasing);

	const deUint32			vertexShader			= gl.createShader(GL_VERTEX_SHADER);
	const deUint32			fragmentShader			= gl.createShader(GL_FRAGMENT_SHADER);

	try
	{
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader()");

		{
			const char* const vertexShaderString	= vertexShaderSource.c_str();
			const char* const fragmentShaderString	= fragmentShaderSource.c_str();

			gl.shaderSource(vertexShader, 1, &vertexShaderString, DE_NULL);
			gl.shaderSource(fragmentShader, 1, &fragmentShaderString, DE_NULL);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource()");
		}

		gl.compileShader(vertexShader);
		gl.compileShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader()");

		gl.attachShader(program, vertexShader);
		gl.attachShader(program, fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader()");

		{
			const bool		vertexCompileOk			= getShaderCompileStatus(gl, vertexShader);
			const bool		fragmentCompileOk		= getShaderCompileStatus(gl, fragmentShader);

			const string	vertexShaderInfoLog		= getShaderInfoLog(gl, vertexShader);
			const string	fragmentShaderInfoLog	= getShaderInfoLog(gl, fragmentShader);

			logShaders(log, vertexShaderSource, vertexShaderInfoLog, vertexCompileOk, fragmentShaderSource, fragmentShaderInfoLog, fragmentCompileOk);

			TCU_CHECK_MSG(vertexCompileOk, "Vertex shader compilation failed");
			TCU_CHECK_MSG(fragmentCompileOk, "Fragment shader compilation failed");
		}

		gl.deleteShader(vertexShader);
		gl.deleteShader(fragmentShader);

		return pair<deUint32, deUint32>(vertexShader, fragmentShader);
	}
	catch (...)
	{
		if (vertexShader != 0)
			gl.deleteShader(vertexShader);

		if (fragmentShader != 0)
			gl.deleteShader(fragmentShader);

		throw;
	}
}